

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block_splitter.cc
# Opt level: O0

size_t brotli::RemapBlockIds(uint8_t *block_ids,size_t length)

{
  mapped_type mVar1;
  size_t sVar2;
  bool bVar3;
  mapped_type *pmVar4;
  ulong local_80;
  size_t i_1;
  _Self local_60;
  ulong local_58;
  size_t i;
  size_t next_id;
  map<unsigned_char,_unsigned_char,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_unsigned_char>_>_>
  new_id;
  size_t length_local;
  uint8_t *block_ids_local;
  
  new_id._M_t._M_impl.super__Rb_tree_header._M_node_count = length;
  std::
  map<unsigned_char,_unsigned_char,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_unsigned_char>_>_>
  ::map((map<unsigned_char,_unsigned_char,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_unsigned_char>_>_>
         *)&next_id);
  i = 0;
  for (local_58 = 0; local_58 < new_id._M_t._M_impl.super__Rb_tree_header._M_node_count;
      local_58 = local_58 + 1) {
    local_60._M_node =
         (_Base_ptr)
         std::
         map<unsigned_char,_unsigned_char,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_unsigned_char>_>_>
         ::find((map<unsigned_char,_unsigned_char,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_unsigned_char>_>_>
                 *)&next_id,block_ids + local_58);
    i_1 = (size_t)std::
                  map<unsigned_char,_unsigned_char,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_unsigned_char>_>_>
                  ::end((map<unsigned_char,_unsigned_char,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_unsigned_char>_>_>
                         *)&next_id);
    bVar3 = std::operator==(&local_60,(_Self *)&i_1);
    if (bVar3) {
      mVar1 = (mapped_type)i;
      pmVar4 = std::
               map<unsigned_char,_unsigned_char,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_unsigned_char>_>_>
               ::operator[]((map<unsigned_char,_unsigned_char,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_unsigned_char>_>_>
                             *)&next_id,block_ids + local_58);
      *pmVar4 = mVar1;
      i = i + 1;
    }
  }
  for (local_80 = 0; sVar2 = i, local_80 < new_id._M_t._M_impl.super__Rb_tree_header._M_node_count;
      local_80 = local_80 + 1) {
    pmVar4 = std::
             map<unsigned_char,_unsigned_char,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_unsigned_char>_>_>
             ::operator[]((map<unsigned_char,_unsigned_char,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_unsigned_char>_>_>
                           *)&next_id,block_ids + local_80);
    block_ids[local_80] = *pmVar4;
  }
  std::
  map<unsigned_char,_unsigned_char,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_unsigned_char>_>_>
  ::~map((map<unsigned_char,_unsigned_char,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_unsigned_char>_>_>
          *)&next_id);
  return sVar2;
}

Assistant:

size_t RemapBlockIds(uint8_t* block_ids, const size_t length) {
  std::map<uint8_t, uint8_t> new_id;
  size_t next_id = 0;
  for (size_t i = 0; i < length; ++i) {
    if (new_id.find(block_ids[i]) == new_id.end()) {
      new_id[block_ids[i]] = static_cast<uint8_t>(next_id);
      ++next_id;
    }
  }
  for (size_t i = 0; i < length; ++i) {
    block_ids[i] = new_id[block_ids[i]];
  }
  return next_id;
}